

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpoint_set.c
# Opt level: O1

int mpt_fpoint_set(mpt_fpoint *pt,mpt_convertable *src,mpt_range *r)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  mpt_fpoint tmp;
  mpt_iterator *it;
  mpt_fpoint local_30;
  undefined8 local_28;
  
  local_30.x = 0.0;
  local_30.y = 0.0;
  if (src == (mpt_convertable *)0x0) {
    local_30.x = 0.0;
    local_30.y = 0.0;
    iVar1 = 0;
  }
  else {
    local_28 = 0;
    iVar1 = (*src->_vptr->convert)(src,0x86,&local_28);
    if (iVar1 < 0) {
      uVar3 = mpt_fpoint_typeid::ptype;
      if ((mpt_fpoint_typeid::ptype == 0) &&
         (uVar3 = mpt_type_add(&mpt_fpoint_typeid::traits), 0 < (int)uVar3)) {
        mpt_fpoint_typeid::ptype = uVar3;
      }
      if ((int)uVar3 < 1) {
        bVar4 = false;
      }
      else {
        iVar1 = (*src->_vptr->convert)(src,(ulong)uVar3,&local_30);
        bVar4 = -1 < iVar1;
      }
      if (!bVar4) {
        return -3;
      }
    }
    else {
      iVar1 = mpt_iterator_consume(local_28,0x66,&local_30);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        local_30.y = local_30.x;
        iVar1 = 1;
      }
      else {
        iVar2 = mpt_iterator_consume(local_28,0x66,&local_30.y);
        iVar1 = 2;
        if (iVar2 < 0) {
          return iVar2;
        }
      }
    }
    if (r != (mpt_range *)0x0) {
      if ((double)local_30.x < r->min) {
        return -2;
      }
      if ((double)local_30.y < r->min) {
        return -2;
      }
      if (r->max < (double)local_30.x) {
        return -2;
      }
      if (r->max < (double)local_30.y) {
        return -2;
      }
    }
  }
  *pt = local_30;
  return iVar1;
}

Assistant:

extern int mpt_fpoint_set(MPT_STRUCT(fpoint) *pt, MPT_INTERFACE(convertable) *src, const MPT_STRUCT(range) *r)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(fpoint) tmp = { 0.0, 0.0 };
	int ret;
	
	if (!src) {
		*pt = tmp;
		return 0;
	}
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) < 0) {
		int type = mpt_fpoint_typeid();
		if (type <= 0 || (ret = src->_vptr->convert(src, type, &tmp)) < 0) {
			return MPT_ERROR(BadType);
		}
	}
	else {
		/* first coordinate */
		if ((ret = mpt_iterator_consume(it, 'f', &tmp.x)) < 0) {
			return ret;
		}
		if (!ret) {
			ret = 1;
			tmp.y = tmp.x;
		}
		else if ((ret = mpt_iterator_consume(it, 'f', &tmp.y)) < 0) {
			return ret;
		}
		else {
			ret = 2;
		}
	}
	if (r) {
		if (tmp.x < r->min || tmp.y < r->min
		 || tmp.x > r->max || tmp.y > r->max) {
			return MPT_ERROR(BadValue);
		}
	}
	*pt = tmp;
	return ret;
}